

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

uint32_t sx_hash_xxh32(void *data,size_t len,uint32_t seed)

{
  XXH32_hash_t XVar1;
  uint32_t seed_local;
  size_t len_local;
  void *data_local;
  
  XVar1 = XXH32(data,len,seed);
  return XVar1;
}

Assistant:

uint32_t sx_hash_xxh32(const void* data, size_t len, uint32_t seed)
{
    return XXH32(data, len, seed);
}